

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Salsa20.c
# Opt level: O1

void Hacl_Salsa20_salsa20_key_block0(uint8_t *out,uint8_t *key,uint8_t *n)

{
  uint32_t k [16];
  uint32_t local_98 [18];
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  local_98[0xc] = 0;
  local_98[0xd] = 0;
  local_98[0xe] = 0;
  local_98[0xf] = 0;
  local_98[8] = 0;
  local_98[9] = 0;
  local_98[10] = 0;
  local_98[0xb] = 0;
  local_98[4] = 0;
  local_98[5] = 0;
  local_98[6] = 0;
  local_98[7] = 0;
  local_98[0] = 0;
  local_98[1] = 0;
  local_98[2] = 0;
  local_98[3] = 0;
  uStack_40 = *(undefined8 *)n;
  local_98[0x10] = 0x61707865;
  local_98[0x11] = (uint32_t)*(undefined8 *)key;
  uStack_50 = (undefined4)((ulong)*(undefined8 *)key >> 0x20);
  uStack_4c = (undefined4)*(undefined8 *)(key + 8);
  local_48 = (undefined4)((ulong)*(undefined8 *)(key + 8) >> 0x20);
  uStack_44 = 0x3320646e;
  local_38 = 0;
  uStack_30 = 0x79622d32;
  uStack_2c = (undefined4)*(undefined8 *)(key + 0x10);
  local_28 = (undefined4)((ulong)*(undefined8 *)(key + 0x10) >> 0x20);
  uStack_24 = (undefined4)*(undefined8 *)(key + 0x18);
  uStack_20 = (undefined4)((ulong)*(undefined8 *)(key + 0x18) >> 0x20);
  uStack_1c = 0x6b206574;
  salsa20_core(local_98,local_98 + 0x10,0);
  *(uint32_t *)out = local_98[0];
  *(uint32_t *)(out + 4) = local_98[1];
  *(uint32_t *)(out + 8) = local_98[2];
  *(uint32_t *)(out + 0xc) = local_98[3];
  *(uint32_t *)(out + 0x10) = local_98[4];
  *(uint32_t *)(out + 0x14) = local_98[5];
  *(uint32_t *)(out + 0x18) = local_98[6];
  *(uint32_t *)(out + 0x1c) = local_98[7];
  *(uint32_t *)(out + 0x20) = local_98[8];
  *(uint32_t *)(out + 0x24) = local_98[9];
  *(uint32_t *)(out + 0x28) = local_98[10];
  *(uint32_t *)(out + 0x2c) = local_98[0xb];
  *(uint32_t *)(out + 0x30) = local_98[0xc];
  *(uint32_t *)(out + 0x34) = local_98[0xd];
  *(uint32_t *)(out + 0x38) = local_98[0xe];
  *(uint32_t *)(out + 0x3c) = local_98[0xf];
  return;
}

Assistant:

void Hacl_Salsa20_salsa20_key_block0(uint8_t *out, uint8_t *key, uint8_t *n)
{
  salsa20_key_block0(out, key, n);
}